

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderInput.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GeometryShader_gl_PointSize_ValueTest::iterate(GeometryShader_gl_PointSize_ValueTest *this)

{
  bool bVar1;
  deUint32 dVar2;
  NotSupportedError *pNVar3;
  RenderContext *pRVar4;
  uint extraout_var;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  MessageBuilder local_8d0;
  uint local_74c;
  undefined1 local_748 [4];
  uint texel_offset_2;
  uint local_5c4;
  undefined1 local_5c0 [4];
  uint texel_offset_1;
  uint local_43c;
  int iStack_438;
  uint texel_offset;
  uint referencePixelCoordinates [2];
  Functions *gl;
  uchar local_418 [8];
  uchar result_image [1024];
  GeometryShader_gl_PointSize_ValueTest *this_local;
  
  result_image._1016_8_ = this;
  if (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) != 1) {
    pNVar3 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar3,"Geometry shader functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
               ,0x3d9);
    __cxa_throw(pNVar3,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if (((this->super_TestCaseBase).m_is_geometry_shader_point_size_supported & 1U) != 1) {
    pNVar3 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar3,"Geometry shader point size functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
               ,0x3de);
    __cxa_throw(pNVar3,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  referencePixelCoordinates[0] = (*pRVar4->_vptr_RenderContext[3])();
  referencePixelCoordinates[1] = extraout_var;
  (**(code **)((long)referencePixelCoordinates + 0x1680))(this->m_program_object_id);
  dVar2 = (**(code **)((long)referencePixelCoordinates + 0x800))();
  glu::checkError(dVar2,"Failed to use program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
                  ,999);
  (**(code **)((long)referencePixelCoordinates + 0x1c0))(0,0,0);
  (**(code **)((long)referencePixelCoordinates + 0x188))(0x4000);
  dVar2 = (**(code **)((long)referencePixelCoordinates + 0x800))();
  glu::checkError(dVar2,"Could not clear the color buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
                  ,0x3ec);
  (**(code **)((long)referencePixelCoordinates + 0x538))(0,0,2);
  dVar2 = (**(code **)((long)referencePixelCoordinates + 0x800))();
  glu::checkError(dVar2,"Call drawArrays() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
                  ,0x3f0);
  (**(code **)((long)referencePixelCoordinates + 0x1220))(0,0,0x10,0x10,0x1908,0x1401,local_418);
  dVar2 = (**(code **)((long)referencePixelCoordinates + 0x800))();
  glu::checkError(dVar2,"Could not read back pixels from color buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
                  ,0x3f5);
  _iStack_438 = 0x800000002;
  bVar1 = TestCaseBase::comparePixel
                    (&this->super_TestCaseBase,local_418,2,8,0x10,0x10,4,0xff,0xff,0xff,0xff);
  if (bVar1) {
    iStack_438 = 0xe;
    texel_offset = 8;
    bVar1 = TestCaseBase::comparePixel
                      (&this->super_TestCaseBase,local_418,0xe,8,0x10,0x10,4,0xff,0xff,0xff,0xff);
    if (bVar1) {
      iStack_438 = 6;
      texel_offset = 8;
      bVar1 = TestCaseBase::comparePixel
                        (&this->super_TestCaseBase,local_418,6,8,0x10,0x10,4,'\0','\0','\0','\0');
      if (bVar1) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
      }
      else {
        local_74c = texel_offset * 0x40 + iStack_438 * 4;
        pTVar5 = tcu::TestContext::getLog
                           ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_8d0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<(&local_8d0,(char (*) [16])0x2b06bcd);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_418 + local_74c);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a3caab);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_418 + (local_74c + 1));
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a3caab);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_418 + (local_74c + 2));
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a3caab);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_418 + (local_74c + 3));
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x29dc08e);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (pMVar6,(char (*) [47])"is different from reference data [0, 0, 0, 0]!");
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_8d0);
        tcu::TestContext::setTestResult
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
    }
    else {
      local_5c4 = texel_offset * 0x40 + iStack_438 * 4;
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_748,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_748,(char (*) [16])0x2b06bcd)
      ;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_418 + local_5c4);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a3caab);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_418 + (local_5c4 + 1));
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a3caab);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_418 + (local_5c4 + 2));
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a3caab);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_418 + (local_5c4 + 3));
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x29dc08e);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(char (*) [56])
                                 " is different from reference data [255, 255, 255, 255]!");
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_748);
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_FAIL,"Fail");
    }
  }
  else {
    local_43c = texel_offset * 0x40 + iStack_438 * 4;
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_5c0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_5c0,(char (*) [16])0x2b06bcd);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_418 + local_43c);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a3caab);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_418 + (local_43c + 1));
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a3caab);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_418 + (local_43c + 2));
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a3caab);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_418 + (local_43c + 3));
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x29dc08e);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [56])
                               " is different from reference data [255, 255, 255, 255]!");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_5c0);
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Fail");
  }
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult GeometryShader_gl_PointSize_ValueTest::iterate()
{
	/* Buffer to store results of rendering */
	unsigned char result_image[m_texture_width * m_texture_height * m_texture_pixel_size];

	/* This test should only run if EXT_geometry_shader is supported */
	if (true != m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	if (true != m_is_geometry_shader_point_size_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_POINT_SIZE_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* GL  */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Render */
	gl.useProgram(m_program_object_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to use program");

	gl.clearColor(0 /* red */, 0 /* green */, 0 /* blue */, 0 /* alpha */);
	gl.clear(GL_COLOR_BUFFER_BIT);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not clear the color buffer");

	gl.drawArrays(GL_POINTS, 0 /* first */, 2 /* count */);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Call drawArrays() failed");

	/* Check if the data was modified during the rendering process */
	gl.readPixels(0 /* x */, 0 /* y */, m_texture_width, m_texture_height, GL_RGBA, GL_UNSIGNED_BYTE, result_image);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not read back pixels from color buffer");

	/* 1) pixel at (2,  8) is (255, 255, 255, 255) */
	unsigned int referencePixelCoordinates[2] = { 2, 8 };

	if (false == comparePixel(result_image, referencePixelCoordinates[0] /* x */, referencePixelCoordinates[1] /* y */,
							  m_texture_width, m_texture_height, m_texture_pixel_size, 255 /* red */, 255 /* green */,
							  255 /* blue */, 255 /* alpha */))
	{
		const unsigned int texel_offset = referencePixelCoordinates[1] * m_texture_width * m_texture_pixel_size +
										  referencePixelCoordinates[0] * m_texture_pixel_size;

		m_testCtx.getLog() << tcu::TestLog::Message << "Rendered data [" << result_image[texel_offset + 0] << ", "
						   << result_image[texel_offset + 1] << ", " << result_image[texel_offset + 2] << ", "
						   << result_image[texel_offset + 3] << "]"
						   << " is different from reference data [255, 255, 255, 255]!" << tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	/* 2) pixel at (14, 8) is (255, 255, 255, 255) */
	referencePixelCoordinates[0] = 14;
	referencePixelCoordinates[1] = 8;

	if (false == comparePixel(result_image, referencePixelCoordinates[0] /* x */, referencePixelCoordinates[1] /* y */,
							  m_texture_width, m_texture_height, m_texture_pixel_size, 255 /* red */, 255 /* green */,
							  255 /* blue */, 255 /* alpha */))
	{
		const unsigned int texel_offset = referencePixelCoordinates[1] * m_texture_width * m_texture_pixel_size +
										  referencePixelCoordinates[0] * m_texture_pixel_size;

		m_testCtx.getLog() << tcu::TestLog::Message << "Rendered data [" << result_image[texel_offset + 0] << ", "
						   << result_image[texel_offset + 1] << ", " << result_image[texel_offset + 2] << ", "
						   << result_image[texel_offset + 3] << "]"
						   << " is different from reference data [255, 255, 255, 255]!" << tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	/* 3) pixel at (6,  8) is (0,   0,   0,   0) */
	referencePixelCoordinates[0] = 6;
	referencePixelCoordinates[1] = 8;

	if (false == comparePixel(result_image, referencePixelCoordinates[0] /* x */, referencePixelCoordinates[1] /* y */,
							  m_texture_width, m_texture_height, m_texture_pixel_size, 0 /* red */, 0 /* green */,
							  0 /* blue */, 0 /* alpha */))
	{
		const unsigned int texel_offset = referencePixelCoordinates[1] * m_texture_width * m_texture_pixel_size +
										  referencePixelCoordinates[0] * m_texture_pixel_size;

		m_testCtx.getLog() << tcu::TestLog::Message << "Rendered data [" << result_image[texel_offset + 0] << ", "
						   << result_image[texel_offset + 1] << ", " << result_image[texel_offset + 2] << ", "
						   << result_image[texel_offset + 3] << "]"
						   << "is different from reference data [0, 0, 0, 0]!" << tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	/* Done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}